

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_EvalThis(JSContext *ctx,JSValue this_obj,char *input,size_t input_len,char *filename,
                   int eval_flags)

{
  JSValue JVar1;
  
  JVar1 = JS_EvalInternal(ctx,this_obj,input,input_len,filename,eval_flags,-1);
  return JVar1;
}

Assistant:

JSValue JS_EvalThis(JSContext *ctx, JSValueConst this_obj,
                    const char *input, size_t input_len,
                    const char *filename, int eval_flags)
{
    int eval_type = eval_flags & JS_EVAL_TYPE_MASK;
    JSValue ret;

    assert(eval_type == JS_EVAL_TYPE_GLOBAL ||
           eval_type == JS_EVAL_TYPE_MODULE);
    ret = JS_EvalInternal(ctx, this_obj, input, input_len, filename,
                          eval_flags, -1);
    return ret;
}